

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeList.h
# Opt level: O2

void __thiscall
Refal2::CNodeList<Refal2::CUnit>::Duplicate
          (CNodeList<Refal2::CUnit> *this,CNodeType *fromNode,CNodeType *toNode,
          CNodeType **fromNodeCopy,CNodeType **toNodeCopy)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CNodeType *pCVar2;
  
  if ((fromNode != (CNodeType *)0x0) && (toNode != (CNodeType *)0x0)) {
    iVar1 = (*this->_vptr_CNodeList[3])();
    pCVar2 = (CNodeType *)CONCAT44(extraout_var,iVar1);
    *fromNodeCopy = pCVar2;
    while (*toNodeCopy = pCVar2, fromNode != toNode) {
      fromNode = fromNode->next;
      iVar1 = (*this->_vptr_CNodeList[3])(this,fromNode);
      (*toNodeCopy)->next = (CNode<Refal2::CUnit> *)CONCAT44(extraout_var_00,iVar1);
      pCVar2 = (*toNodeCopy)->next;
      pCVar2->prev = *toNodeCopy;
    }
    return;
  }
  __assert_fail("fromNode != nullptr && toNode != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/NodeList.h"
                ,0x138,
                "virtual void Refal2::CNodeList<Refal2::CUnit>::Duplicate(const CNodeType *, const CNodeType *, CNodeType *&, CNodeType *&) [T = Refal2::CUnit]"
               );
}

Assistant:

void CNodeList<T>::Duplicate( const CNodeType* fromNode,
	const CNodeType* toNode, CNodeType*& fromNodeCopy, CNodeType*& toNodeCopy )
{
	assert( fromNode != nullptr && toNode != nullptr );
	fromNodeCopy = Alloc( *fromNode );
	toNodeCopy = fromNodeCopy;
	while( fromNode != toNode ) {
		fromNode = fromNode->next;
		toNodeCopy->next = Alloc( *fromNode );
		toNodeCopy->next->prev = toNodeCopy;
		toNodeCopy = toNodeCopy->next;
	}
}